

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc-time.c
# Opt level: O3

float rtosc_secfracs2float(uint64_t secfracs)

{
  int rd;
  float flt;
  char as_hex_str [16];
  float local_2c;
  char local_28 [24];
  
  snprintf(local_28,0x10,"0x%xp-32",secfracs);
  __isoc99_sscanf(local_28,"%f%n",&local_2c);
  return local_2c;
}

Assistant:

float rtosc_secfracs2float(uint64_t secfracs)
{
    char as_hex_str[16];
    // print as hex string (lossless)
    int written = snprintf(as_hex_str, 16, "0x%xp-32", (unsigned)secfracs);
    assert(written >= 0); // no error
    assert(written < 16); // size suffices
    (void) written;

    float flt;
    int rd = 0;
    // scan hex string as float (can have loss)
    sscanf(as_hex_str, "%f%n", &flt, &rd);
    assert(rd);
    return flt;
}